

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O1

void nn_msgqueue_init(nn_msgqueue *self,size_t maxmem)

{
  nn_msgqueue_chunk *pnVar1;
  
  self->count = 0;
  self->mem = 0;
  self->maxmem = maxmem;
  pnVar1 = (nn_msgqueue_chunk *)nn_alloc_(0x2f48);
  if (pnVar1 != (nn_msgqueue_chunk *)0x0) {
    pnVar1->next = (nn_msgqueue_chunk *)0x0;
    (self->out).chunk = pnVar1;
    (self->out).pos = 0;
    (self->in).chunk = pnVar1;
    (self->in).pos = 0;
    self->cache = (nn_msgqueue_chunk *)0x0;
    return;
  }
  nn_msgqueue_init_cold_1();
}

Assistant:

void nn_msgqueue_init (struct nn_msgqueue *self, size_t maxmem)
{
    struct nn_msgqueue_chunk *chunk;

    self->count = 0;
    self->mem = 0;
    self->maxmem = maxmem;

    chunk = nn_alloc (sizeof (struct nn_msgqueue_chunk), "msgqueue chunk");
    alloc_assert (chunk);
    chunk->next = NULL;

    self->out.chunk = chunk;
    self->out.pos = 0;
    self->in.chunk = chunk;
    self->in.pos = 0;

    self->cache = NULL;
}